

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::SlicePlane(SlicePlane *this,string *name_)

{
  mat<4,_4,_float,_(glm::qualifier)0> value_;
  undefined1 auVar1 [16];
  undefined1 auVar3 [16];
  Engine *this_00;
  vec3 value__00;
  vec<3,_float,_(glm::qualifier)0> value__01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *local_1b0;
  string *local_1a8;
  PersistentValue<float> *local_1a0;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *local_198;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *local_190;
  PersistentValue<bool> *local_188;
  PersistentValue<bool> *local_180;
  PersistentValue<bool> *local_178;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar2 [40];
  
  std::__cxx11::string::string((string *)this,(string *)name_);
  local_1a8 = (string *)&this->postfix;
  std::__cxx11::to_string((string *)local_1a8,DAT_0059cd80 - state::slicePlanes >> 3);
  uniquePrefix_abi_cxx11_(&local_1d0,this);
  std::operator+(&local_1f0,&local_1d0,"#active");
  PersistentValue<bool>::PersistentValue(&this->active,&local_1f0,true);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_178 = &this->active;
  uniquePrefix_abi_cxx11_(&local_1d0,this);
  std::operator+(&local_1f0,&local_1d0,"#drawPlane");
  PersistentValue<bool>::PersistentValue(&this->drawPlane,&local_1f0,true);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_180 = &this->drawPlane;
  uniquePrefix_abi_cxx11_(&local_1d0,this);
  std::operator+(&local_1f0,&local_1d0,"#drawWidget");
  PersistentValue<bool>::PersistentValue(&this->drawWidget,&local_1f0,true);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_188 = &this->drawWidget;
  uniquePrefix_abi_cxx11_(&local_1d0,this);
  std::operator+(&local_1f0,&local_1d0,"#object_transform");
  local_1b0 = &this->objectTransform;
  local_70 = 0x3f800000;
  uStack_6c = 0;
  uStack_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0x3f800000;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0x3f800000;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_34 = 0x3f800000;
  auVar2 = ZEXT2440(CONCAT816(0x3f80000000000000,ZEXT816(0x3f800000)));
  value_.value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  value_.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  auVar1 = auVar2._0_16_;
  auVar3 = auVar2._16_16_;
  value_.value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar1._0_4_;
  value_.value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar1._4_4_;
  value_.value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)auVar1._8_4_;
  value_.value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)auVar1._12_4_;
  value_.value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar3._0_4_;
  value_.value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar3._4_4_;
  value_.value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)auVar3._8_4_;
  value_.value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)auVar3._12_4_;
  value_.value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar2._32_4_;
  value_.value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar2._36_4_;
  value_.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  value_.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  value_.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  value_.value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::PersistentValue
            (local_1b0,&local_1f0,value_);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  uniquePrefix_abi_cxx11_(&local_1d0,this);
  std::operator+(&local_1f0,&local_1d0,"#color");
  value__00 = getNextUniqueColor();
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->color,&local_1f0,value__00);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_190 = &this->color;
  uniquePrefix_abi_cxx11_(&local_1d0,this);
  std::operator+(&local_1f0,&local_1d0,"#gridLineColor");
  local_198 = &this->gridLineColor;
  value__01.field_2.z = 0.97;
  value__01.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f7851ec;
  value__01.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f7851ec;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (local_198,&local_1f0,value__01);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  uniquePrefix_abi_cxx11_(&local_1d0,this);
  std::operator+(&local_1f0,&local_1d0,"#transparency");
  local_1a0 = &this->transparency;
  PersistentValue<float>::PersistentValue(local_1a0,&local_1f0,0.5);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  this->shouldInspectMesh = false;
  std::__cxx11::string::string((string *)&this->inspectedMeshName,"",(allocator *)&local_1f0);
  (this->volumeInspectProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->volumeInspectProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uniquePrefix_abi_cxx11_(&local_1f0,this);
  std::operator+(&local_90,&local_1f0,"#transformGizmo");
  TransformationGizmo::TransformationGizmo
            (&this->transformGizmo,&local_90,&(this->objectTransform).value,local_1b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_1f0);
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[3].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[3].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[3].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[0].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[0].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[0].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uniquePrefix_abi_cxx11_(&local_1d0,this);
  std::operator+(&local_1f0,&local_1d0,"#slice1");
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)&this->sliceBufferArr,(ManagedBufferRegistry *)0x0,
             &local_1f0,(this->sliceBufferDataArr)._M_elems);
  uniquePrefix_abi_cxx11_(&local_d0,this);
  std::operator+(&local_b0,&local_d0,"#slice2");
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)&(this->sliceBufferArr).field_0xe8,
             (ManagedBufferRegistry *)0x0,&local_b0,(this->sliceBufferDataArr)._M_elems + 1);
  uniquePrefix_abi_cxx11_(&local_110,this);
  std::operator+(&local_f0,&local_110,"#slice3");
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)&(this->sliceBufferArr).field_0x1d0,
             (ManagedBufferRegistry *)0x0,&local_f0,(this->sliceBufferDataArr)._M_elems + 2);
  uniquePrefix_abi_cxx11_(&local_150,this);
  std::operator+(&local_130,&local_150,"#slice4");
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)&(this->sliceBufferArr).field_0x2b8,
             (ManagedBufferRegistry *)0x0,&local_130,(this->sliceBufferDataArr)._M_elems + 3);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  (this->planeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->planeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = render::engine;
  std::__cxx11::string::string((string *)&local_170,local_1a8);
  render::Engine::addSlicePlane(this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  PersistentValue<bool>::set(&(this->transformGizmo).enabled,true);
  prepare(this);
  return;
}

Assistant:

SlicePlane::SlicePlane(std::string name_)
    : name(name_), postfix(std::to_string(state::slicePlanes.size())), active(uniquePrefix() + "#active", true),
      drawPlane(uniquePrefix() + "#drawPlane", true), drawWidget(uniquePrefix() + "#drawWidget", true),
      objectTransform(uniquePrefix() + "#object_transform", glm::mat4(1.0)),
      color(uniquePrefix() + "#color", getNextUniqueColor()),
      gridLineColor(uniquePrefix() + "#gridLineColor", glm::vec3{.97, .97, .97}),
      transparency(uniquePrefix() + "#transparency", 0.5), shouldInspectMesh(false), inspectedMeshName(""),
      transformGizmo(uniquePrefix() + "#transformGizmo", objectTransform.get(), &objectTransform),
      sliceBufferArr{{{nullptr, uniquePrefix() + "#slice1", sliceBufferDataArr[0]},
                      {nullptr, uniquePrefix() + "#slice2", sliceBufferDataArr[1]},
                      {nullptr, uniquePrefix() + "#slice3", sliceBufferDataArr[2]},
                      {nullptr, uniquePrefix() + "#slice4", sliceBufferDataArr[3]}}}

{
  render::engine->addSlicePlane(postfix);
  transformGizmo.enabled = true;
  prepare();
}